

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseSelect(TidyDocImpl *doc,Node *field,GetTokenMode mode)

{
  Lexer *pLVar1;
  TidyParserMemory data;
  Bool BVar2;
  Node *node_00;
  code *pcStack_98;
  TidyParserMemory memory_1;
  TidyParserMemory memory;
  Node *node;
  Lexer *lexer;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *field_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  pNStack_20 = field;
  if (field == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&memory_1.register_2,doc);
    pNStack_20 = (Node *)memory.identity;
  }
  pLVar1->insert = (IStack *)0x0;
  while( true ) {
    node_00 = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node_00 == (Node *)0x0) {
      prvTidyReport(doc,pNStack_20,(Node *)0x0,0x25a);
      return (Node *)0x0;
    }
    if ((node_00->tag == pNStack_20->tag) && (node_00->type == EndTag)) break;
    BVar2 = InsertMisc(pNStack_20,node_00);
    if (BVar2 == no) {
      if ((node_00->type == StartTag) &&
         (((((node_00 != (Node *)0x0 && (node_00->tag != (Dict *)0x0)) &&
            (node_00->tag->id == TidyTag_OPTION)) ||
           ((((node_00 != (Node *)0x0 && (node_00->tag != (Dict *)0x0)) &&
             (node_00->tag->id == TidyTag_OPTGROUP)) ||
            (((node_00 != (Node *)0x0 && (node_00->tag != (Dict *)0x0)) &&
             (node_00->tag->id == TidyTag_DATALIST)))))) ||
          (((node_00 != (Node *)0x0 && (node_00->tag != (Dict *)0x0)) &&
           (node_00->tag->id == TidyTag_SCRIPT)))))) {
        memset(&pcStack_98,0,0x30);
        pcStack_98 = prvTidyParseSelect;
        memory_1.identity = (Parser *)pNStack_20;
        memory_1.original_node = node_00;
        prvTidyInsertNodeAtEnd(pNStack_20,node_00);
        data.original_node = (Node *)memory_1.identity;
        data.identity = pcStack_98;
        data.reentry_node = memory_1.original_node;
        data._24_8_ = memory_1.reentry_node;
        data.mode = memory_1.reentry_mode;
        data.register_1 = memory_1.reentry_state;
        data.register_2 = memory_1.mode;
        data._44_4_ = memory_1.register_1;
        prvTidypushMemory(doc,data);
        return node_00;
      }
      prvTidyReport(doc,pNStack_20,node_00,0x235);
      prvTidyFreeNode(doc,node_00);
    }
  }
  prvTidyFreeNode(doc,node_00);
  pNStack_20->closed = yes;
  TrimSpaces(doc,pNStack_20);
  return (Node *)0x0;
}

Assistant:

Node* TY_(ParseSelect)( TidyDocImpl* doc, Node *field, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    DEBUG_LOG_COUNTERS;

    if ( field == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        field = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(field);
    }
    
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == field->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            field->closed = yes;
            TrimSpaces(doc, field);

            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(field, node))
            continue;

        if ( node->type == StartTag &&
             ( nodeIsOPTION(node)   ||
               nodeIsOPTGROUP(node) ||
               nodeIsDATALIST(node) ||
               nodeIsSCRIPT(node))
           )
        {
            TidyParserMemory memory = {0};
            memory.identity = TY_(ParseSelect);
            memory.original_node = field;
            memory.reentry_node = node;

            TY_(InsertNodeAtEnd)(field, node);
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, field, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, field, node, MISSING_ENDTAG_FOR);

    DEBUG_LOG_EXIT;
    return NULL;
}